

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPELinker.cxx
# Opt level: O1

bool __thiscall
cmBinUtilsWindowsPELinker::ResolveDependency
          (cmBinUtilsWindowsPELinker *this,string *name,string *origin,string *path,bool *resolved)

{
  pointer pcVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long *plVar3;
  long *plVar4;
  pointer pbVar5;
  __string_type __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  long *local_90;
  ulong local_88;
  long local_80 [2];
  bool *local_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  __x = cmRuntimeDependencyArchive::GetSearchDirectories_abi_cxx11_
                  ((this->super_cmBinUtilsLinker).Archive);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&local_48,
           (const_iterator)
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start,origin);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = false;
  }
  else {
    pbVar5 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_70 = resolved;
    do {
      local_90 = local_80;
      pcVar1 = (pbVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + pbVar5->_M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_90,(ulong)(name->_M_dataplus)._M_p);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_58 = *plVar4;
        lStack_50 = plVar3[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar4;
        local_68 = (long *)*plVar3;
      }
      local_60 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)path,(string *)&local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      bVar2 = cmsys::SystemTools::PathExists(path);
      resolved = local_70;
      if (bVar2) {
        bVar2 = true;
        goto LAB_003a4725;
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    bVar2 = false;
  }
LAB_003a4725:
  *resolved = bVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return true;
}

Assistant:

bool cmBinUtilsWindowsPELinker::ResolveDependency(std::string const& name,
                                                  std::string const& origin,
                                                  std::string& path,
                                                  bool& resolved)
{
  auto dirs = this->Archive->GetSearchDirectories();

#ifdef _WIN32
  char buf[MAX_PATH];
  unsigned int len;
  if ((len = GetWindowsDirectoryA(buf, MAX_PATH)) > 0) {
    dirs.insert(dirs.begin(), std::string(buf, len));
  }
  if ((len = GetSystemDirectoryA(buf, MAX_PATH)) > 0) {
    dirs.insert(dirs.begin(), std::string(buf, len));
  }
#endif

  dirs.insert(dirs.begin(), origin);

  for (auto const& searchPath : dirs) {
    path = searchPath + '/' + name;
    if (cmSystemTools::PathExists(path)) {
      resolved = true;
      return true;
    }
  }

  resolved = false;
  return true;
}